

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

string * __thiscall
cfd::core::Privkey::ConvertWif_abi_cxx11_
          (string *__return_storage_ptr__,Privkey *this,NetType net_type,bool is_compressed)

{
  int iVar1;
  uchar *priv_key;
  CfdException *this_00;
  undefined8 uVar2;
  char *wally_string;
  KeyFormatData *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  CfdError error_code;
  allocator local_131;
  string local_130 [32];
  string local_110;
  CfdSourceLocation local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  int local_ac;
  WallyUtil *pWStack_a8;
  int ret;
  char *wif_ptr;
  uint32_t flags;
  uint32_t prefix;
  KeyFormatData format_data;
  bool is_compressed_local;
  NetType net_type_local;
  Privkey *this_local;
  string *wif;
  
  format_data.bip84_.pubkey_version._3_1_ = is_compressed;
  format_data.bip84_.privkey_version = net_type;
  GetKeyFormatData((KeyFormatData *)&flags,net_type);
  wif_ptr._4_4_ = KeyFormatData::GetWifPrefix((KeyFormatData *)&flags);
  wif_ptr._0_4_ = (byte)~format_data.bip84_.pubkey_version._3_1_ & 1;
  pWStack_a8 = (WallyUtil *)0x0;
  ByteData::GetBytes(&local_c8,&this->data_);
  priv_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x471ece);
  this_00 = (CfdException *)ByteData::GetDataSize(&this->data_);
  iVar1 = wally_wif_from_bytes
                    (priv_key,(size_t)this_00,wif_ptr._4_4_,(uint)wif_ptr,
                     (char **)&stack0xffffffffffffff58);
  error_code = (CfdError)((ulong)priv_key >> 0x20);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffe90));
  local_ac = iVar1;
  if (iVar1 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,pWStack_a8,wally_string);
    KeyFormatData::~KeyFormatData(in_stack_fffffffffffffe80);
    return __return_storage_ptr__;
  }
  local_f0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_f0.filename = local_f0.filename + 1;
  local_f0.line = 0x2a6;
  local_f0.funcname = "ConvertWif";
  ByteData::GetHex_abi_cxx11_(&local_110,&this->data_);
  logger::warn<int&,std::__cxx11::string>
            (&local_f0,"wally_wif_from_bytes error. ret={} bytes={}.",&local_ac,&local_110);
  ::std::__cxx11::string::~string((string *)&local_110);
  uVar2 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_130,"Error Private key to WIF.",&local_131);
  CfdException::CfdException(this_00,error_code,(string *)CONCAT44(iVar1,in_stack_fffffffffffffe90))
  ;
  __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string Privkey::ConvertWif(NetType net_type, bool is_compressed) const {
  auto format_data = GetKeyFormatData(net_type);
  uint32_t prefix = format_data.GetWifPrefix();
  uint32_t flags =
      (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                     : WALLY_WIF_FLAG_UNCOMPRESSED);
  char *wif_ptr = NULL;

  int ret = wally_wif_from_bytes(
      data_.GetBytes().data(), data_.GetDataSize(), prefix, flags, &wif_ptr);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_wif_from_bytes error. ret={} bytes={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Error Private key to WIF.");
  }
  std::string wif = WallyUtil::ConvertStringAndFree(wif_ptr);
  return wif;
}